

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

QTextStream * operator<<(QTextStream *out,Rule *r)

{
  bool bVar1;
  reference pQVar2;
  QTextStream *pQVar3;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  const_iterator name;
  list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
  *in_stack_ffffffffffffffc0;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = std::_List_iterator<QString>::operator*((_List_iterator<QString> *)0x11dbb4);
  pQVar3 = (QTextStream *)QTextStream::operator<<(in_RDI,(QString *)pQVar2);
  QTextStream::operator<<(pQVar3," ::=");
  local_10._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_10._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::begin
                 (in_stack_ffffffffffffffc0);
  while( true ) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::end
                   (in_stack_ffffffffffffffc0);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (!bVar1) break;
    pQVar3 = (QTextStream *)QTextStream::operator<<(in_RDI," ");
    std::_List_const_iterator<std::_List_iterator<QString>_>::operator*
              ((_List_const_iterator<std::_List_iterator<QString>_> *)0x11dc37);
    pQVar2 = std::_List_iterator<QString>::operator*((_List_iterator<QString> *)0x11dc3f);
    QTextStream::operator<<(pQVar3,(QString *)pQVar2);
    std::_List_const_iterator<std::_List_iterator<QString>_>::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &operator << (QTextStream &out, const Rule &r)
{
  out << *r.lhs << " ::=";

  for (NameList::const_iterator name = r.rhs.begin (); name != r.rhs.end (); ++name)
    out << " " << **name;

  return out;
}